

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator%(sc_signed *__return_storage_ptr__,sc_signed *u,sc_unsigned *v)

{
  undefined8 in_RAX;
  sc_length_param local_14;
  
  local_14.m_len = (int)((ulong)in_RAX >> 0x20);
  if (v->sgn == 0 || u->sgn == 0) {
    div_by_zero<int>(v->sgn);
    sc_length_param::sc_length_param(&local_14);
    sc_signed::sc_signed(__return_storage_ptr__,local_14.m_len);
  }
  else {
    mod_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,v->nbits,v->ndigits
                      ,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator%(const sc_signed& u, const sc_unsigned& v)
{

  if ((u.sgn == SC_ZERO) || (v.sgn == SC_ZERO)) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return mod_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);
}